

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawget(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TValue local_f8;
  RecordIndex ix;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  ix.oldv._4_4_ = J->base[1];
  if ((((uint)ix.oldv & 0x1f000000) == 0xb000000) && (ix.oldv._4_4_ != 0)) {
    ix.tab = 0;
    ix.mt = 0;
    local_f8.u64 = rd->argv->u64 & 0x7fffffffffff | 0xfffa000000000000;
    ix.tabv = rd->argv[1];
    ix._64_8_ = rd;
    TVar1 = lj_record_idx(J,(RecordIndex *)&local_f8.gcr);
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawget(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0]; ix.key = J->base[1];
  if (tref_istab(ix.tab) && ix.key) {
    ix.val = 0; ix.idxchain = 0;
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    copyTV(J->L, &ix.keyv, &rd->argv[1]);
    J->base[0] = lj_record_idx(J, &ix);
  }  /* else: Interpreter will throw. */
}